

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  code *pcVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  undefined4 *puVar8;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar5 = (int)CONCAT62(in_register_0000003a,op);
  uVar7 = iVar5 - 0x97;
  if (uVar7 < 0xf) {
    if ((0x78U >> (uVar7 & 0x1f) & 1) == 0) {
      if ((7U >> (uVar7 & 0x1f) & 1) == 0) {
        if ((0x6000U >> (uVar7 & 0x1f) & 1) != 0) {
          Output::Print(L" R%d[R%d]",(ulong)data->Instance,(ulong)data->Element);
          return;
        }
        goto LAB_007f18c5;
      }
      goto LAB_007f18f9;
    }
  }
  else {
LAB_007f18c5:
    if ((0x3f < iVar5 - 0x117U) ||
       ((0xe000000000000019U >> ((ulong)(iVar5 - 0x117U) & 0x3f) & 1) == 0)) {
      if (iVar5 != 0x2b) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                    ,0x20b,"(false)","Unknown OpCode for OpLayoutElementI");
        if (bVar6) {
          *puVar8 = 0;
          return;
        }
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
LAB_007f18f9:
      bVar1 = data->Value;
      bVar2 = data->Instance;
      bVar3 = data->Element;
      form = L" R%d = R%d[R%d]";
      goto LAB_007f190b;
    }
  }
  bVar1 = data->Instance;
  bVar2 = data->Element;
  bVar3 = data->Value;
  form = L" R%d[R%d] = R%d";
LAB_007f190b:
  Output::Print(form,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementI(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::ProfiledLdElemI_A:
            case OpCode::LdElemI_A:
            case OpCode::LdMethodElem:
            case OpCode::TypeofElem:
            {
                Output::Print(_u(" R%d = R%d[R%d]"), data->Value, data->Instance, data->Element);
                break;
            }
            case OpCode::ProfiledStElemI_A:
            case OpCode::ProfiledStElemI_A_Strict:
            case OpCode::StElemI_A:
            case OpCode::StElemI_A_Strict:
            case OpCode::InitSetElemI:
            case OpCode::InitGetElemI:
            case OpCode::InitComputedProperty:
            case OpCode::InitClassMemberComputedName:
            case OpCode::InitClassMemberGetComputedName:
            case OpCode::InitClassMemberSetComputedName:
            {
                Output::Print(_u(" R%d[R%d] = R%d"), data->Instance, data->Element, data->Value);
                break;
            }
            case OpCode::DeleteElemI_A:
            case OpCode::DeleteElemIStrict_A:
            {
                Output::Print(_u(" R%d[R%d]"), data->Instance, data->Element);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementI");
                break;
            }
        }
    }